

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O0

void PDHG_Update_Average(CUPDLPwork *work)

{
  long lVar1;
  long in_RDI;
  double dVar2;
  cupdlp_float dMeanStepSize;
  CUPDLPvec *yUpdate;
  CUPDLPvec *xUpdate;
  cupdlp_int iter;
  CUPDLPiterates *iterates;
  CUPDLPstepsize *stepsize;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  cupdlp_float *x;
  cupdlp_float *alpha;
  CUPDLPwork *w;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  x = *(cupdlp_float **)(in_RDI + 0x18);
  w = (CUPDLPwork *)x[(long)((**(int **)(in_RDI + 0x30) + 1) % 2) + 10];
  alpha = x;
  dVar2 = sqrt(*(double *)(lVar1 + 8) * *(double *)(lVar1 + 0x10));
  cupdlp_axpy(w,(cupdlp_int)((ulong)dVar2 >> 0x20),alpha,x,(cupdlp_float *)0x8028ba);
  cupdlp_axpy(w,(cupdlp_int)((ulong)dVar2 >> 0x20),alpha,x,(cupdlp_float *)0x8028e2);
  *(double *)(lVar1 + 0x18) = dVar2 + *(double *)(lVar1 + 0x18);
  *(double *)(lVar1 + 0x20) = dVar2 + *(double *)(lVar1 + 0x20);
  return;
}

Assistant:

void PDHG_Update_Average(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *xUpdate = iterates->x[(iter + 1) % 2];
  CUPDLPvec *yUpdate = iterates->y[(iter + 1) % 2];

  // PDLP weighs average iterates in this way
  cupdlp_float dMeanStepSize =
      sqrt(stepsize->dPrimalStep * stepsize->dDualStep);
  // AddToVector(iterates->xSum, dMeanStepSize, xUpdate, lp->nCols);
  // AddToVector(iterates->ySum, dMeanStepSize, yUpdate, lp->nRows);
  cupdlp_axpy(work, lp->nCols, &dMeanStepSize, xUpdate->data, iterates->xSum);
  cupdlp_axpy(work, lp->nRows, &dMeanStepSize, yUpdate->data, iterates->ySum);

  stepsize->dSumPrimalStep += dMeanStepSize;
  stepsize->dSumDualStep += dMeanStepSize;
}